

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O3

Sle_Man_t * Sle_ManAlloc(Gia_Man_t *pGia,int nLevels,int fVerbose)

{
  int iVar1;
  int iVar2;
  Sle_Man_t *pSVar3;
  Vec_Bit_t *vMask;
  Vec_Int_t *vCuts;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  long lVar7;
  size_t __size;
  
  pSVar3 = (Sle_Man_t *)calloc(1,0xa0);
  pSVar3->pGia = pGia;
  pSVar3->nLevels = nLevels;
  pSVar3->fVerbose = fVerbose;
  vMask = Sle_ManInternalNodeMask(pGia);
  pSVar3->vMask = vMask;
  vCuts = Sle_ManComputeCuts(pGia,4,fVerbose);
  pSVar3->vCuts = vCuts;
  pVVar4 = Sle_ManCollectCutFanins(pGia,vCuts,vMask);
  pSVar3->vCutFanins = pVVar4;
  iVar2 = pGia->nObjs;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  iVar1 = 8;
  if (6 < iVar2 - 1U) {
    iVar1 = iVar2;
  }
  pVVar4->nCap = iVar1;
  if (iVar1 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar1,0x10);
  }
  pVVar4->pArray = pVVar5;
  pVVar4->nSize = iVar2;
  pSVar3->vFanoutEdges = pVVar4;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  pVVar5 = (Vec_Int_t *)calloc(100,0x10);
  pVVar4->pArray = pVVar5;
  pSVar3->vEdgeCuts = pVVar4;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar1 = iVar2;
  }
  pVVar5->nCap = iVar1;
  if (iVar1 == 0) {
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = iVar2;
    pSVar3->vObjMap = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 0;
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = iVar2;
    pSVar3->vCutFirst = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 0;
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = iVar2;
    pSVar3->vEdgeFirst = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 0;
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = iVar2;
  }
  else {
    lVar7 = (long)iVar2;
    __size = (long)iVar1 << 2;
    piVar6 = (int *)malloc(__size);
    pVVar5->pArray = piVar6;
    pVVar5->nSize = iVar2;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0xff,lVar7 * 4);
    }
    pSVar3->vObjMap = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = iVar1;
    piVar6 = (int *)malloc(__size);
    pVVar5->pArray = piVar6;
    pVVar5->nSize = iVar2;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0xff,lVar7 * 4);
    }
    pSVar3->vCutFirst = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = iVar1;
    piVar6 = (int *)malloc(__size);
    pVVar5->pArray = piVar6;
    pVVar5->nSize = iVar2;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0xff,lVar7 * 4);
    }
    pSVar3->vEdgeFirst = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = iVar1;
    piVar6 = (int *)malloc(__size);
    pVVar5->pArray = piVar6;
    pVVar5->nSize = iVar2;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0xff,lVar7 << 2);
    }
  }
  pSVar3->vDelayFirst = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  pSVar3->vPolars = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  pSVar3->vLits = pVVar5;
  iVar2 = Sle_ManComputeDelay(pGia,vCuts);
  pSVar3->nLevels = iVar2;
  return pSVar3;
}

Assistant:

Sle_Man_t * Sle_ManAlloc( Gia_Man_t * pGia, int nLevels, int fVerbose )
{
    Sle_Man_t * p   = ABC_CALLOC( Sle_Man_t, 1 );
    p->pGia         = pGia;
    p->nLevels      = nLevels;
    p->fVerbose     = fVerbose;
    p->vMask        = Sle_ManInternalNodeMask( pGia );
    p->vCuts        = Sle_ManComputeCuts( pGia, 4, fVerbose );
    p->vCutFanins   = Sle_ManCollectCutFanins( pGia, p->vCuts, p->vMask );
    p->vFanoutEdges = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->vEdgeCuts    = Vec_WecAlloc( 100 );
    p->vObjMap      = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vCutFirst    = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vEdgeFirst   = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vDelayFirst  = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vPolars      = Vec_IntAlloc( 100 );
    p->vLits        = Vec_IntAlloc( 100 );
    p->nLevels      = Sle_ManComputeDelay( pGia, p->vCuts );
    return p;
}